

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_option_abi_cxx11_(Formatter *this,Option *opt,bool is_positional)

{
  anon_class_16_2_577437cb __f;
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  byte in_CL;
  undefined8 in_RDX;
  long *in_RSI;
  string *in_RDI;
  double dVar7;
  bool skipFirstLinePrefix_1;
  int adjustedLongNamesColumnWidth;
  int shortNamesOverSize;
  int longNamesColumnWidth;
  int shortNamesColumnWidth;
  string longNames;
  string shortNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vlongNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vshortNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string desc_1;
  string opts;
  string namesCombined;
  bool skipFirstLinePrefix;
  string desc;
  string left;
  stringstream out;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffa60;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffa68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  char *in_stack_fffffffffffffaa8;
  float local_504;
  allocator local_471;
  string local_470 [32];
  string local_450 [35];
  undefined1 local_42d;
  int local_42c;
  int local_428;
  int local_424;
  int local_420;
  int local_41c;
  string local_418 [32];
  int local_3f8;
  int local_3f4;
  int local_3f0;
  allocator local_3e9;
  string local_3e8 [24];
  undefined7 in_stack_fffffffffffffc30;
  char in_stack_fffffffffffffc37;
  string *in_stack_fffffffffffffc38;
  allocator local_3a1;
  string local_3a0 [32];
  string local_380 [32];
  anon_class_16_2_577437cb local_360;
  undefined1 *local_350;
  undefined1 *local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  undefined1 local_330 [24];
  undefined1 local_318 [48];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [39];
  allocator local_281;
  string local_280 [35];
  undefined1 local_25d;
  int local_25c;
  string local_258 [32];
  string local_238 [48];
  string local_208 [32];
  string local_1e8 [15];
  undefined1 in_stack_fffffffffffffe27;
  string *in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  ostream *in_stack_fffffffffffffe40;
  stringstream local_1a8 [16];
  ostream local_198 [383];
  byte local_19;
  undefined8 local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  if ((local_19 & 1) == 0) {
    (**(code **)(*in_RSI + 0x60))(local_2a8,in_RSI,local_18,0);
    (**(code **)(*in_RSI + 0x68))(local_2c8,in_RSI,local_18);
    (**(code **)(*in_RSI + 0x70))(local_2e8,in_RSI,local_18);
    detail::split(in_stack_fffffffffffffc38,in_stack_fffffffffffffc37);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x12e2c1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x12e2d6);
    local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(in_stack_fffffffffffffa58);
    local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(in_stack_fffffffffffffa58);
    __f.vlongNames = in_stack_fffffffffffffa58;
    __f.vshortNames =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x12e350;
    local_350 = local_318;
    local_348 = local_330;
    local_360 = ::std::
                for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_option(CLI::Option_const*,bool)const::_lambda(std::__cxx11::string_const&)_1_>
                          (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,__f);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_3a0,", ",&local_3a1);
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffc38,
               (string *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    ::std::__cxx11::string::~string(local_3a0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_3e8,", ",&local_3e9);
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffc38,
               (string *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    ::std::__cxx11::string::~string(local_3e8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    local_3f0 = (int)((ulong)in_RSI[1] / 5);
    local_504 = (float)(ulong)in_RSI[1];
    dVar7 = std::ceil((double)(ulong)(uint)((local_504 / 5.0) * 4.0));
    local_3f4 = (int)SUB84(dVar7,0);
    local_3f8 = 0;
    lVar4 = ::std::__cxx11::string::length();
    if (lVar4 == 0) {
      local_420 = (int)std::setw(local_3f0);
      poVar2 = ::std::operator<<(local_198,(_Setw)local_420);
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,std::left);
      ::std::operator<<(poVar2,"");
    }
    else {
      ::std::operator+(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
      ::std::__cxx11::string::operator=(local_380,local_418);
      ::std::__cxx11::string::~string(local_418);
      lVar4 = ::std::__cxx11::string::length();
      if (lVar4 == 0) {
        lVar4 = ::std::__cxx11::string::length();
        if (lVar4 != 0) {
          ::std::__cxx11::string::operator+=(local_380,local_2c8);
        }
      }
      lVar4 = ::std::__cxx11::string::length();
      if (lVar4 != 0) {
        ::std::__cxx11::string::operator+=(local_380,",");
      }
      iVar1 = ::std::__cxx11::string::length();
      if (local_3f0 <= iVar1) {
        ::std::__cxx11::string::operator+=(local_380," ");
        local_3f8 = ::std::__cxx11::string::length();
        local_3f8 = local_3f8 - local_3f0;
      }
      local_41c = (int)std::setw(local_3f0);
      poVar2 = ::std::operator<<(local_198,(_Setw)local_41c);
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,std::left);
      ::std::operator<<(poVar2,local_380);
    }
    piVar5 = std::min<int>(&local_3f8,&local_3f4);
    local_3f8 = *piVar5;
    local_424 = local_3f4 - local_3f8;
    lVar4 = ::std::__cxx11::string::length();
    if (lVar4 == 0) {
      poVar2 = local_198;
      local_42c = (int)std::setw(local_424);
      poVar2 = ::std::operator<<(poVar2,(_Setw)local_42c);
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,std::left);
      ::std::operator<<(poVar2,"");
    }
    else {
      lVar4 = ::std::__cxx11::string::length();
      if (lVar4 != 0) {
        ::std::__cxx11::string::operator+=((string *)&stack0xfffffffffffffc38,local_2c8);
      }
      iVar1 = ::std::__cxx11::string::length();
      if (local_424 <= iVar1) {
        ::std::__cxx11::string::operator+=((string *)&stack0xfffffffffffffc38," ");
      }
      local_428 = (int)std::setw(local_424);
      poVar2 = ::std::operator<<(local_198,(_Setw)local_428);
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,std::left);
      ::std::operator<<(poVar2,(string *)&stack0xfffffffffffffc38);
    }
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_42d = 1;
      ::std::__cxx11::stringstream::str();
      uVar6 = ::std::__cxx11::string::length();
      uVar3 = in_RSI[1];
      ::std::__cxx11::string::~string(local_450);
      if (uVar3 < uVar6) {
        ::std::operator<<(local_198,'\n');
        local_42d = 0;
      }
      in_stack_fffffffffffffa70 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RSI[1];
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_470,(ulong)in_stack_fffffffffffffa70,' ',&local_471);
      detail::streamOutAsParagraph
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                 in_stack_fffffffffffffe28,(bool)in_stack_fffffffffffffe27);
      ::std::__cxx11::string::~string(local_470);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_471);
    }
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffc38);
    ::std::__cxx11::string::~string(local_380);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffa70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffa70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffa70);
    ::std::__cxx11::string::~string(local_2e8);
    ::std::__cxx11::string::~string(local_2c8);
    ::std::__cxx11::string::~string(local_2a8);
  }
  else {
    (**(code **)(*in_RSI + 0x60))(local_208,in_RSI,local_18,1);
    ::std::operator+((char *)in_stack_fffffffffffffa68._M_current,
                     in_stack_fffffffffffffa60._M_current);
    (**(code **)(*in_RSI + 0x68))(local_238,in_RSI,local_18);
    ::std::operator+(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
    ::std::__cxx11::string::~string(local_238);
    ::std::__cxx11::string::~string(local_1e8);
    ::std::__cxx11::string::~string(local_208);
    (**(code **)(*in_RSI + 0x70))(local_258,in_RSI,local_18);
    local_25c = (int)std::setw((int)in_RSI[1]);
    poVar2 = ::std::operator<<(local_198,(_Setw)local_25c);
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,std::left);
    ::std::operator<<(poVar2,(string *)&stack0xfffffffffffffe38);
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_25d = 1;
      uVar3 = ::std::__cxx11::string::length();
      if ((ulong)in_RSI[1] <= uVar3) {
        ::std::operator<<(local_198,'\n');
        local_25d = 0;
      }
      uVar3 = in_RSI[1];
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_280,uVar3,' ',&local_281);
      detail::streamOutAsParagraph
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                 in_stack_fffffffffffffe28,(bool)in_stack_fffffffffffffe27);
      ::std::__cxx11::string::~string(local_280);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_281);
    }
    ::std::__cxx11::string::~string(local_258);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
  }
  ::std::operator<<(local_198,'\n');
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option(const Option *opt, bool is_positional) const {
    std::stringstream out;
    if(is_positional) {
        const std::string left = "  " + make_option_name(opt, true) + make_option_opts(opt);
        const std::string desc = make_option_desc(opt);
        out << std::setw(static_cast<int>(column_width_)) << std::left << left;

        if(!desc.empty()) {
            bool skipFirstLinePrefix = true;
            if(left.length() >= column_width_) {
                out << '\n';
                skipFirstLinePrefix = false;
            }
            detail::streamOutAsParagraph(
                out, desc, right_column_width_, std::string(column_width_, ' '), skipFirstLinePrefix);
        }
    } else {
        const std::string namesCombined = make_option_name(opt, false);
        const std::string opts = make_option_opts(opt);
        const std::string desc = make_option_desc(opt);

        // Split all names at comma and sort them into short names and long names
        const auto names = detail::split(namesCombined, ',');
        std::vector<std::string> vshortNames;
        std::vector<std::string> vlongNames;
        std::for_each(names.begin(), names.end(), [&vshortNames, &vlongNames](const std::string &name) {
            if(name.find("--", 0) != std::string::npos)
                vlongNames.push_back(name);
            else
                vshortNames.push_back(name);
        });

        // Assemble short and long names
        std::string shortNames = detail::join(vshortNames, ", ");
        std::string longNames = detail::join(vlongNames, ", ");

        // Calculate setw sizes
        const auto shortNamesColumnWidth = static_cast<int>(column_width_ / 5);  // 20% left for short names
        const auto longNamesColumnWidth = static_cast<int>(std::ceil(
            static_cast<float>(column_width_) / 5.0f * 4.0f));  // 80% right for long names and options, ceil result
        int shortNamesOverSize = 0;

        // Print short names
        if(shortNames.length() > 0) {
            shortNames = "  " + shortNames;  // Indent
            if(longNames.length() == 0 && opts.length() > 0)
                shortNames += opts;  // Add opts if only short names and no long names
            if(longNames.length() > 0)
                shortNames += ",";
            if(static_cast<int>(shortNames.length()) >= shortNamesColumnWidth) {
                shortNames += " ";
                shortNamesOverSize = static_cast<int>(shortNames.length()) - shortNamesColumnWidth;
            }
            out << std::setw(shortNamesColumnWidth) << std::left << shortNames;
        } else {
            out << std::setw(shortNamesColumnWidth) << std::left << "";
        }

        // Adjust long name column width in case of short names column reaching into long names column
        shortNamesOverSize =
            (std::min)(shortNamesOverSize, longNamesColumnWidth);  // Prevent negative result with unsigned integers
        const auto adjustedLongNamesColumnWidth = longNamesColumnWidth - shortNamesOverSize;

        // Print long names
        if(longNames.length() > 0) {
            if(opts.length() > 0)
                longNames += opts;
            if(static_cast<int>(longNames.length()) >= adjustedLongNamesColumnWidth)
                longNames += " ";

            out << std::setw(adjustedLongNamesColumnWidth) << std::left << longNames;
        } else {
            out << std::setw(adjustedLongNamesColumnWidth) << std::left << "";
        }

        if(!desc.empty()) {
            bool skipFirstLinePrefix = true;
            if(out.str().length() > column_width_) {
                out << '\n';
                skipFirstLinePrefix = false;
            }
            detail::streamOutAsParagraph(
                out, desc, right_column_width_, std::string(column_width_, ' '), skipFirstLinePrefix);
        }
    }

    out << '\n';
    return out.str();
}